

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O0

void __thiscall
MarkdownHighlighter::clearRangesForBlock(MarkdownHighlighter *this,int blockNumber,RangeType type)

{
  bool bVar1;
  QList<MarkdownHighlighter::InlineRange> *this_00;
  iterator o;
  const_iterator local_98;
  RangeType local_8c;
  InlineRange *local_88;
  iterator local_80;
  InlineRange *local_78;
  const_iterator local_70 [3];
  int local_54;
  QList<MarkdownHighlighter::InlineRange> *local_50;
  QList<MarkdownHighlighter::InlineRange> *rangeList;
  QList<MarkdownHighlighter::InlineRange> local_30;
  anon_class_4_1_89923c38_for__M_pred local_18;
  int local_14;
  RangeType type_local;
  int blockNumber_local;
  MarkdownHighlighter *this_local;
  
  local_18.type = type;
  local_14 = blockNumber;
  _type_local = this;
  memset(&rangeList,0,0x18);
  QList<MarkdownHighlighter::InlineRange>::QList
            ((QList<MarkdownHighlighter::InlineRange> *)&rangeList);
  QHash<int,_QList<MarkdownHighlighter::InlineRange>_>::value
            (&local_30,&this->_ranges,&local_14,
             (QList<MarkdownHighlighter::InlineRange> *)&rangeList);
  bVar1 = QList<MarkdownHighlighter::InlineRange>::isEmpty(&local_30);
  QList<MarkdownHighlighter::InlineRange>::~QList(&local_30);
  QList<MarkdownHighlighter::InlineRange>::~QList
            ((QList<MarkdownHighlighter::InlineRange> *)&rangeList);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    QSyntaxHighlighter::currentBlock();
    local_54 = QTextBlock::blockNumber();
    this_00 = QHash<int,_QList<MarkdownHighlighter::InlineRange>_>::operator[]
                        (&this->_ranges,&local_54);
    local_50 = this_00;
    local_80 = QList<MarkdownHighlighter::InlineRange>::begin(this_00);
    local_88 = (InlineRange *)QList<MarkdownHighlighter::InlineRange>::end(local_50);
    local_8c = local_18.type;
    local_78 = (InlineRange *)
               std::
               remove_if<QList<MarkdownHighlighter::InlineRange>::iterator,MarkdownHighlighter::clearRangesForBlock(int,MarkdownHighlighter::RangeType)::__0>
                         (local_80,(iterator)local_88,local_18);
    QList<MarkdownHighlighter::InlineRange>::const_iterator::const_iterator
              (local_70,(iterator)local_78);
    o = QList<MarkdownHighlighter::InlineRange>::end(local_50);
    QList<MarkdownHighlighter::InlineRange>::const_iterator::const_iterator(&local_98,o);
    QList<MarkdownHighlighter::InlineRange>::erase(this_00,local_70[0],local_98);
  }
  return;
}

Assistant:

void MarkdownHighlighter::clearRangesForBlock(int blockNumber, RangeType type)
{
    if (!_ranges.value(blockNumber).isEmpty()) {
        auto& rangeList = _ranges[currentBlock().blockNumber()];
        rangeList.erase(std::remove_if(rangeList.begin(), rangeList.end(),
                                       [type](const InlineRange& range) {
           return range.type == type;
        }), rangeList.end());
    }
}